

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_infohashes.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::sample_infohashes_observer::reply(sample_infohashes_observer *this,msg *m)

{
  observer_flags_t *poVar1;
  uint uVar2;
  protocol_descriptor *ppVar3;
  sample_infohashes *this_00;
  pointer __dest;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  pointer pbVar7;
  ulong uVar8;
  dht_observer *pdVar9;
  ulong uVar10;
  char *__src;
  uint *puVar11;
  char **in;
  long lVar12;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> v;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  nodes;
  bdecode_node samples;
  bdecode_node id;
  bdecode_node r;
  bdecode_node n;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_1c8;
  pointer local_1a8;
  pointer ppStack_1a0;
  pointer local_198;
  sha1_hash local_188;
  msg *local_170;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_168;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_148;
  bdecode_node local_130;
  undefined1 local_f0 [64];
  bdecode_node local_b0;
  bdecode_node local_70;
  
  key_01._M_str = "r";
  key_01._M_len = 1;
  local_170 = m;
  bdecode_node::dict_find_dict(&local_b0,m->message,key_01);
  bVar4 = bdecode_node::operator_cast_to_bool(&local_b0);
  if (bVar4) {
    local_1a8 = (pointer)0x0;
    ppStack_1a0 = (pointer)0x0;
    local_198 = (pointer)0x0;
    ppVar3 = ((this->super_traversal_observer).super_observer.m_algorithm.
              super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_node->m_protocol;
    uVar2 = (ppVar3->protocol).super_udp.family_;
    in = (char **)ppVar3->nodes_key;
    sVar6 = strlen((char *)in);
    key_02._M_str = (char *)in;
    key_02._M_len = sVar6;
    bdecode_node::dict_find_string(&local_70,&local_b0,key_02);
    bVar4 = bdecode_node::operator_cast_to_bool(&local_70);
    if (bVar4) {
      pbVar7 = (pointer)bdecode_node::string_ptr(&local_70);
      local_130.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar7;
      iVar5 = bdecode_node::string_length(&local_70);
      lVar12 = 0x1a;
      if (uVar2 == 10) {
        lVar12 = 0x26;
      }
      if (lVar12 <= (long)((long)pbVar7 +
                          ((long)iVar5 -
                          (long)local_130.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start))) {
        do {
          read_node_endpoint<char_const*&>
                    ((node_endpoint *)local_f0,(dht *)(ulong)uVar2,(udp)(int)&local_130,in);
          ::std::
          vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
          ::
          emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>&>
                    ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                      *)&local_1a8,(digest32<160L> *)local_f0,
                     (basic_endpoint<boost::asio::ip::udp> *)
                     ((long)&(((bdecode_node *)local_f0)->m_tokens).
                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        } while (lVar12 <= (long)((long)pbVar7 +
                                 ((long)iVar5 -
                                 (long)local_130.m_tokens.
                                       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
      }
    }
    key_03._M_str = "id";
    key_03._M_len = 2;
    bdecode_node::dict_find_string((bdecode_node *)local_f0,&local_b0,key_03);
    bVar4 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_f0);
    if ((bVar4) && (iVar5 = bdecode_node::string_length((bdecode_node *)local_f0), iVar5 == 0x14)) {
      key._M_str = "interval";
      key._M_len = 8;
      uVar8 = bdecode_node::dict_find_int_value(&local_b0,key,-1);
      if (uVar8 < 0x5461) {
        key_00._M_str = "num";
        key_00._M_len = 3;
        uVar10 = bdecode_node::dict_find_int_value(&local_b0,key_00,-1);
        if (uVar10 >> 0x1f == 0) {
          key_04._M_str = "samples";
          key_04._M_len = 7;
          bdecode_node::dict_find_string(&local_130,&local_b0,key_04);
          bVar4 = bdecode_node::operator_cast_to_bool(&local_130);
          if ((bVar4) &&
             (iVar5 = bdecode_node::string_length(&local_130),
             (iVar5 * -0x33333333 + 0x19999998U >> 2 | iVar5 * 0x40000000) < 0xccccccd)) {
            iVar5 = bdecode_node::string_length(&local_130);
            ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ::vector(&local_1c8,(long)(iVar5 / 0x14),(allocator_type *)&local_188);
            __dest = local_1c8.
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __src = bdecode_node::string_ptr(&local_130);
            memcpy(__dest,__src,
                   (long)local_1c8.
                         super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1c8.
                         super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            this_00 = (sample_infohashes *)
                      (this->super_traversal_observer).super_observer.m_algorithm.
                      super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            puVar11 = (uint *)bdecode_node::string_ptr((bdecode_node *)local_f0);
            if (puVar11 == (uint *)0x0) {
              local_188.m_number._M_elems[0] = 0;
              local_188.m_number._M_elems[1] = 0;
              local_188.m_number._M_elems[2] = 0;
              local_188.m_number._M_elems[3] = 0;
              local_188.m_number._M_elems[4] = 0;
            }
            else {
              local_188.m_number._M_elems[4] = puVar11[4];
              local_188.m_number._M_elems._0_8_ = *(undefined8 *)puVar11;
              local_188.m_number._M_elems._8_8_ = *(undefined8 *)(puVar11 + 2);
            }
            local_148.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_1c8.
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_148.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1c8.
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_148.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1c8.
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1c8.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1c8.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1c8.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_168.
            super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = local_1a8;
            local_168.
            super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppStack_1a0;
            local_168.
            super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_198;
            local_1a8 = (pointer)0x0;
            ppStack_1a0 = (pointer)0x0;
            local_198 = (pointer)0x0;
            sample_infohashes::got_samples
                      (this_00,&local_188,(time_duration)(uVar8 * 1000000000),(int)uVar10,&local_148
                       ,&local_168);
            if (local_168.
                super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_168.
                              super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_168.
                                    super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_168.
                                    super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148.
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_148.
                              super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_148.
                                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_148.
                                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_1c8.
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1c8.
                              super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1c8.
                                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1c8.
                                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            pdVar9 = observer::get_observer((observer *)this);
            (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
                      (pdVar9,4,"[%u] wrong or missing samples value",
                       (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                               super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_id);
            observer::timeout((observer *)this);
          }
          traversal_observer::reply(&this->super_traversal_observer,local_170);
          poVar1 = &(this->super_traversal_observer).super_observer.flags;
          poVar1->m_val = poVar1->m_val | 0x80;
          if (local_130.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_130.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_130.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_130.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          pdVar9 = observer::get_observer((observer *)this);
          (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
                    (pdVar9,4,"[%u] wrong or missing num value",
                     (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                             super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_id);
          observer::timeout((observer *)this);
        }
      }
      else {
        pdVar9 = observer::get_observer((observer *)this);
        (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
                  (pdVar9,4,"[%u] wrong or missing interval value",
                   (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                           super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_id);
        observer::timeout((observer *)this);
      }
    }
    else {
      pdVar9 = observer::get_observer((observer *)this);
      (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
                (pdVar9,4,"[%u] wrong or missing id value",
                 (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                         super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_id);
      observer::timeout((observer *)this);
    }
    if ((pointer)local_f0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ - local_f0._0_8_);
    }
    if (local_70.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a8 != (pointer)0x0) {
      operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
    }
  }
  else {
    pdVar9 = observer::get_observer((observer *)this);
    (*(pdVar9->super_dht_logger)._vptr_dht_logger[1])
              (pdVar9,4,"[%u] missing response dict",
               (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                       super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_id);
    observer::timeout((observer *)this);
  }
  if (local_b0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sample_infohashes_observer::reply(msg const& m)
{
	bdecode_node r = m.message.dict_find_dict("r");
	if (!r)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] missing response dict"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	// look for nodes
	std::vector<std::pair<sha1_hash, udp::endpoint>> nodes;
	udp const protocol = algorithm()->get_node().protocol();
	int const protocol_size = int(aux::address_size(protocol));
	char const* nodes_key = algorithm()->get_node().protocol_nodes_key();
	bdecode_node const n = r.dict_find_string(nodes_key);
	if (n)
	{
		char const* ptr = n.string_ptr();
		char const* end = ptr + n.string_length();

		while (end - ptr >= 20 + protocol_size + 2)
		{
			node_endpoint nep = read_node_endpoint(protocol, ptr);
			nodes.emplace_back(nep.id, nep.ep);
		}
	}

	bdecode_node const id = r.dict_find_string("id");
	if (!id || id.string_length() != 20)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing id value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	std::int64_t const interval = r.dict_find_int_value("interval", -1);
	if (interval < 0 || interval > 21600) // TODO: put constant in a common place
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing interval value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	std::int64_t const num = r.dict_find_int_value("num", -1);
	if (num < 0 || num > std::numeric_limits<int>::max())
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing num value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	bdecode_node samples = r.dict_find_string("samples");
	if (samples && (samples.string_length() % 20 == 0))
	{
		std::vector<sha1_hash> v(aux::numeric_cast<std::size_t>(samples.string_length() / 20));
		std::memcpy(v.data(), samples.string_ptr(), v.size() * 20);

		static_cast<sample_infohashes*>(algorithm())->got_samples(
			node_id(id.string_ptr()), seconds(interval), int(num), std::move(v), std::move(nodes));
	}
	else
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing samples value"
			, algorithm()->id());
#endif
		timeout();
	}

	// we deliberately do not call
	traversal_observer::reply(m);
	// this is necessary to play nice with
	// observer::abort(), observer::done() and observer::timeout()
	flags |= flag_done;
}